

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

config * mpt::clientConfig(void)

{
  config *pcVar1;
  bool bVar2;
  undefined1 local_30 [8];
  path p;
  
  if (cfg == (convertable *)0x0) {
    path::path((path *)local_30,(char *)0x0,0x2e,0);
    path::set((path *)local_30,"mpt.client",-1,-1,-1);
    cfg = &config::global((path *)local_30)->super_convertable;
    bVar2 = cfg != (convertable *)0x0;
    if (bVar2) {
      atexit(unrefConfig);
    }
    else {
      p.first = '\0';
      p.flags = '\0';
      p.sep = '\0';
      p.assign = '\0';
      p._28_4_ = 0;
    }
    path::~path((path *)local_30);
    if (!bVar2) {
      return (config *)p._24_8_;
    }
  }
  pcVar1 = convertable::operator_cast_to_config_(cfg);
  return pcVar1;
}

Assistant:

static config *clientConfig()
{
	if (!cfg) {
		static const char dest[] = "mpt.client\0";
		path p;
		p.set(dest);
		if (!(cfg = config::global(&p))) {
			return 0;
		}
		atexit(unrefConfig);
	}
	return *cfg;
}